

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QList<QPersistentModelIndex> *
qSelectionIndexes<QList<QPersistentModelIndex>>(QItemSelection *selection)

{
  bool bVar1;
  const_iterator o;
  QList<QPersistentModelIndex> *in_RSI;
  QList<QPersistentModelIndex> *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionRange *range;
  QItemSelection *__range1;
  QList<QPersistentModelIndex> *result;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QItemSelectionRange> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x82ab83);
  local_10.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QItemSelectionRange>::begin(in_stack_ffffffffffffff90);
  o = QList<QItemSelectionRange>::end(in_stack_ffffffffffffff90);
  while (bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<QItemSelectionRange>::const_iterator::operator*(&local_10);
    indexesFromRange<QList<QPersistentModelIndex>>
              ((QItemSelectionRange *)CONCAT17(uVar2,in_stack_ffffffffffffffc8),in_RSI);
    QList<QItemSelectionRange>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static ModelIndexContainer qSelectionIndexes(const QItemSelection &selection)
{
    ModelIndexContainer result;
    for (const auto &range : selection)
        indexesFromRange(range, result);
    return result;
}